

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

mapped_type * __thiscall
phmap::priv::
btree_map_container<phmap::priv::btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_256,_false>_>_>
::operator[](btree_map_container<phmap::priv::btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_256,_false>_>_>
             *this,key_type *k)

{
  pointer ppVar1;
  pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_*>,_bool>
  local_20;
  
  try_emplace<>(&local_20,this,k);
  ppVar1 = btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_*>
           ::operator->(&local_20.first);
  return &ppVar1->second;
}

Assistant:

mapped_type &operator[](key_type &&k) {
            return try_emplace(std::move(k)).first->second;
        }